

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

UINT GetConsoleCP(void)

{
  if (PAL_InitializeChakraCoreCalled) {
    GetACP();
    if (PAL_InitializeChakraCoreCalled != false) {
      return 0xfde9;
    }
  }
  abort();
}

Assistant:

UINT
PALAPI
GetConsoleCP(
     VOID)
{
    UINT nRet = 0;
    PERF_ENTRY(GetConsoleCP);
    ENTRY("GetConsoleCP()\n");

    nRet = GetACP();

    LOGEXIT("GetConsoleCP returns UINT %d\n", nRet );
    PERF_EXIT(GetConsoleCP);
    return nRet;
}